

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
               (Descriptor *message,string *classname)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  Descriptor *message_00;
  EnumDescriptor *this;
  int local_28;
  int local_24;
  int i_1;
  int i;
  string *classname_local;
  Descriptor *message_local;
  
  psVar4 = Descriptor::name_abi_cxx11_(message);
  _Var1 = std::operator==(psVar4,classname);
  if (_Var1) {
    message_local._7_1_ = true;
  }
  else {
    for (local_24 = 0; iVar3 = Descriptor::nested_type_count(message), local_24 < iVar3;
        local_24 = local_24 + 1) {
      message_00 = Descriptor::nested_type(message,local_24);
      bVar2 = MessageHasConflictingClassName(message_00,classname);
      if (bVar2) {
        return true;
      }
    }
    for (local_28 = 0; iVar3 = Descriptor::enum_type_count(message), local_28 < iVar3;
        local_28 = local_28 + 1) {
      this = Descriptor::enum_type(message,local_28);
      psVar4 = EnumDescriptor::name_abi_cxx11_(this);
      _Var1 = std::operator==(psVar4,classname);
      if (_Var1) {
        return true;
      }
    }
    message_local._7_1_ = false;
  }
  return message_local._7_1_;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    const string& classname) {
  if (message->name() == classname) return true;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (message->enum_type(i)->name() == classname) {
      return true;
    }
  }
  return false;
}